

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnGlobal(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  pointer *ppGVar1;
  iterator __position;
  GlobalType local_10;
  
  local_10.mutable_ = mutable_;
  __position._M_current =
       (this->globals_).
       super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->globals_).
      super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.type = type;
    std::
    vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>::
    _M_realloc_insert<wabt::SharedValidator::GlobalType>(&this->globals_,__position,&local_10);
  }
  else {
    (__position._M_current)->mutable_ = mutable_;
    *(undefined3 *)&(__position._M_current)->field_0x9 = local_10._9_3_;
    (__position._M_current)->type = type;
    ppGVar1 = &(this->globals_).
               super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  return (Result)Ok;
}

Assistant:

Result SharedValidator::OnGlobal(const Location& loc,
                                 Type type,
                                 bool mutable_) {
  globals_.push_back(GlobalType{type, mutable_});
  return Result::Ok;
}